

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

Layer * ncnn::create_layer_naive(int index)

{
  Layer *pLVar1;
  
  if (0x6a < (uint)index) {
    return (Layer *)0x0;
  }
  pLVar1 = (Layer *)0x0;
  if ((index != 1) && (index != 0x22)) {
    pLVar1 = (Layer *)(*(code *)(&PTR_AbsVal_layer_creator_005fd338)[(ulong)(uint)index * 2])(0);
    pLVar1->typeindex = index;
  }
  return pLVar1;
}

Assistant:

Layer* create_layer_naive(int index)
{
    if (index < 0 || index >= layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(0);
    layer->typeindex = index;
    return layer;
}